

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

QSize * __thiscall
QPlatformPrintDevice::supportedPageSizeMatch(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  bool bVar1;
  const_iterator o;
  QPageSize *pQVar2;
  QPageSize *in_RDX;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QPageSize *ps;
  add_const_t<QList<QPageSize>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QSize *in_stack_ffffffffffffff88;
  QSize *lhs;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  bVar1 = QListSpecialMethodsBase<QPageSize>::contains<QPageSize>
                    ((QListSpecialMethodsBase<QPageSize> *)in_RDI,
                     (QPageSize *)in_stack_ffffffffffffff88);
  if (bVar1) {
    QPageSize::QPageSize((QPageSize *)lhs,in_RDX);
  }
  else {
    local_10.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
    local_10 = QList<QPageSize>::begin((QList<QPageSize> *)lhs);
    o = QList<QPageSize>::end((QList<QPageSize> *)lhs);
    while( true ) {
      bVar1 = QList<QPageSize>::const_iterator::operator!=(&local_10,o);
      if (!bVar1) break;
      pQVar2 = QList<QPageSize>::const_iterator::operator*(&local_10);
      QPageSize::sizePoints();
      QPageSize::sizePoints();
      bVar1 = ::operator==(lhs,in_stack_ffffffffffffff88);
      if (bVar1) {
        QPageSize::QPageSize((QPageSize *)lhs,pQVar2);
        goto LAB_001320f3;
      }
      QList<QPageSize>::const_iterator::operator++(&local_10);
    }
    QPageSize::QPageSize((QPageSize *)lhs);
  }
LAB_001320f3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSizeMatch(const QPageSize &pageSize) const
{
    // If it's a known page size, just return itself
    if (m_pageSizes.contains(pageSize))
        return pageSize;

    // Try to find a supported page size based on point size
    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.sizePoints() == pageSize.sizePoints())
            return ps;
    }
    return QPageSize();
}